

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlReaderNewDoc(xmlTextReaderPtr reader,xmlChar *cur,char *URL,char *encoding,int options)

{
  int size;
  int len;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *cur_local;
  xmlTextReaderPtr reader_local;
  
  if (cur == (xmlChar *)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else {
    size = xmlStrlen(cur);
    reader_local._4_4_ = xmlReaderNewMemory(reader,(char *)cur,size,URL,encoding,options);
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlReaderNewDoc(xmlTextReaderPtr reader, const xmlChar * cur,
                const char *URL, const char *encoding, int options)
{

    int len;

    if (cur == NULL)
        return (-1);
    if (reader == NULL)
        return (-1);

    len = xmlStrlen(cur);
    return (xmlReaderNewMemory(reader, (const char *)cur, len,
                               URL, encoding, options));
}